

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

void parse_blend_design_positions(T1_Face face,T1_Loader loader)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  bool bVar3;
  FT_UInt FVar4;
  FT_Fixed FVar5;
  FT_UInt FVar6;
  T1_TokenRec *pTVar7;
  long lVar8;
  PS_Blend pPVar9;
  long lVar10;
  undefined1 local_248 [8];
  T1_TokenRec design_tokens [16];
  T1_TokenRec axis_tokens [4];
  FT_UInt local_3c;
  FT_UInt local_38;
  FT_Int num_designs;
  FT_Int n_axis;
  
  (*(loader->parser).root.funcs.to_token_array)
            ((PS_Parser)loader,(T1_Token)local_248,0x10,(FT_Int *)&local_3c);
  if ((int)local_3c < 0) {
    num_designs = 0xa2;
  }
  else {
    num_designs = 3;
    if ((int)local_3c < 0x11 && local_3c != 0) {
      pFVar1 = (loader->parser).root.cursor;
      pFVar2 = (loader->parser).root.limit;
      if ((int)local_3c < 1) {
        num_designs = 0;
      }
      else {
        pPVar9 = face->blend;
        lVar10 = 0;
        FVar6 = 0;
        num_designs = 0;
        do {
          (loader->parser).root.cursor = *(FT_Byte **)&design_tokens[lVar10 + -1].type;
          (loader->parser).root.limit = design_tokens[lVar10].start;
          (*(loader->parser).root.funcs.to_token_array)
                    ((PS_Parser)loader,(T1_Token)&design_tokens[0xf].type,4,(FT_Int *)&local_38);
          FVar4 = local_38;
          if (lVar10 == 0) {
            if (local_38 - 5 < 0xfffffffc) goto LAB_00236b83;
            num_designs = t1_allocate_blend(face,local_3c,local_38);
            FVar6 = FVar4;
            if (num_designs == 0) {
              num_designs = 0;
              pPVar9 = face->blend;
              goto LAB_00236b28;
            }
            bVar3 = false;
          }
          else if (local_38 == FVar6) {
LAB_00236b28:
            bVar3 = true;
            if (0 < (int)local_38) {
              pTVar7 = axis_tokens;
              lVar8 = 0;
              do {
                (loader->parser).root.cursor = *(FT_Byte **)&pTVar7[-1].type;
                (loader->parser).root.limit = pTVar7->start;
                FVar5 = (*(loader->parser).root.funcs.to_fixed)((PS_Parser)loader,0);
                pPVar9->design_pos[lVar10][lVar8] = FVar5;
                lVar8 = lVar8 + 1;
                pTVar7 = pTVar7 + 1;
              } while (lVar8 < (int)local_38);
              bVar3 = true;
            }
          }
          else {
LAB_00236b83:
            num_designs = 3;
            bVar3 = false;
          }
          if (!bVar3) goto LAB_00236bf6;
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)local_3c);
      }
      (loader->parser).root.cursor = pFVar1;
      (loader->parser).root.limit = pFVar2;
    }
  }
LAB_00236bf6:
  (loader->parser).root.error = num_designs;
  return;
}

Assistant:

static void
  parse_blend_design_positions( T1_Face    face,
                                T1_Loader  loader )
  {
    T1_TokenRec  design_tokens[T1_MAX_MM_DESIGNS];
    FT_Int       num_designs;
    FT_Int       num_axis;
    T1_Parser    parser = &loader->parser;

    FT_Error     error = FT_Err_Ok;
    PS_Blend     blend;


    /* get the array of design tokens -- compute number of designs */
    T1_ToTokenArray( parser, design_tokens,
                     T1_MAX_MM_DESIGNS, &num_designs );
    if ( num_designs < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_designs == 0 || num_designs > T1_MAX_MM_DESIGNS )
    {
      FT_ERROR(( "parse_blend_design_positions:"
                 " incorrect number of designs: %d\n",
                 num_designs ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    {
      FT_Byte*  old_cursor = parser->root.cursor;
      FT_Byte*  old_limit  = parser->root.limit;
      FT_Int    n;


      blend    = face->blend;
      num_axis = 0;  /* make compiler happy */

      for ( n = 0; n < num_designs; n++ )
      {
        T1_TokenRec  axis_tokens[T1_MAX_MM_AXIS];
        T1_Token     token;
        FT_Int       axis, n_axis;


        /* read axis/coordinates tokens */
        token = design_tokens + n;
        parser->root.cursor = token->start;
        parser->root.limit  = token->limit;
        T1_ToTokenArray( parser, axis_tokens, T1_MAX_MM_AXIS, &n_axis );

        if ( n == 0 )
        {
          if ( n_axis <= 0 || n_axis > T1_MAX_MM_AXIS )
          {
            FT_ERROR(( "parse_blend_design_positions:"
                       " invalid number of axes: %d\n",
                       n_axis ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          num_axis = n_axis;
          error = t1_allocate_blend( face,
                                     (FT_UInt)num_designs,
                                     (FT_UInt)num_axis );
          if ( error )
            goto Exit;
          blend = face->blend;
        }
        else if ( n_axis != num_axis )
        {
          FT_ERROR(( "parse_blend_design_positions: incorrect table\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /* now read each axis token into the design position */
        for ( axis = 0; axis < n_axis; axis++ )
        {
          T1_Token  token2 = axis_tokens + axis;


          parser->root.cursor = token2->start;
          parser->root.limit  = token2->limit;
          blend->design_pos[n][axis] = T1_ToFixed( parser, 0 );
        }
      }

      loader->parser.root.cursor = old_cursor;
      loader->parser.root.limit  = old_limit;
    }

  Exit:
    loader->parser.root.error = error;
  }